

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  long lVar1;
  Type TVar2;
  uint32 uVar3;
  int iVar4;
  int32 iVar5;
  string *value_00;
  ulong uVar6;
  int64 value_01;
  size_t sVar7;
  LogMessage *pLVar8;
  size_t sStack_50;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar2 = FieldDescriptor::type(field);
  switch(TVar2) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x47c);
    pLVar8 = LogMessage::operator<<(&local_40,"Unsupported");
    LogFinisher::operator=(&local_41,pLVar8);
    goto LAB_0028ae00;
  case TYPE_INT64:
    uVar6 = MapKey::GetInt64Value(value);
    goto LAB_0028ae42;
  case TYPE_UINT64:
    uVar6 = MapKey::GetUInt64Value(value);
LAB_0028ae42:
    lVar1 = 0x3f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = (int)lVar1;
LAB_0028ae6e:
    sStack_50 = (size_t)(iVar4 * 9 + 0x49U >> 6);
    break;
  case TYPE_INT32:
    iVar5 = MapKey::GetInt32Value(value);
    sVar7 = io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    return sVar7;
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sStack_50 = 8;
    break;
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sStack_50 = 4;
    break;
  case TYPE_BOOL:
    sStack_50 = 1;
    break;
  case TYPE_STRING:
    value_00 = MapKey::GetStringValue_abi_cxx11_(value);
    sVar7 = WireFormatLite::StringSize(value_00);
    return sVar7;
  case TYPE_UINT32:
    uVar3 = MapKey::GetUInt32Value(value);
    iVar4 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_0028ae6e;
  case TYPE_SINT32:
    iVar5 = MapKey::GetInt32Value(value);
    sVar7 = WireFormatLite::SInt32Size(iVar5);
    return sVar7;
  case MAX_TYPE:
    value_01 = MapKey::GetInt64Value(value);
    sVar7 = WireFormatLite::SInt64Size(value_01);
    return sVar7;
  default:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x497);
    pLVar8 = LogMessage::operator<<(&local_40,"Cannot get here");
    LogFinisher::operator=(&local_41,pLVar8);
LAB_0028ae00:
    LogMessage::~LogMessage(&local_40);
    sStack_50 = 0;
  }
  return sStack_50;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}